

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msocket_server.c
# Opt level: O0

void msocket_server_destroy(msocket_server_t *self)

{
  msocket_t *acceptSocket;
  void *result;
  msocket_server_t *self_local;
  
  if (self != (msocket_server_t *)0x0) {
    result = self;
    pthread_mutex_lock((pthread_mutex_t *)&self->mutex);
    *(undefined1 *)((long)result + 0xa8) = 1;
    if (*result == 0) {
      pthread_mutex_unlock((pthread_mutex_t *)((long)result + 0x80));
    }
    else {
      msocket_close(*result);
      pthread_mutex_unlock((pthread_mutex_t *)((long)result + 0x80));
      pthread_join(*(pthread_t *)((long)result + 0x50),&acceptSocket);
    }
    if (*(long *)((long)result + 0xe8) != 0) {
      pthread_join(*(pthread_t *)((long)result + 0x58),&acceptSocket);
    }
    msocket_ary_destroy((long)result + 0x20);
    sem_destroy((sem_t *)((long)result + 0x60));
    pthread_mutex_destroy((pthread_mutex_t *)((long)result + 0x80));
    if (*(long *)((long)result + 0x10) != 0) {
      free(*(void **)((long)result + 0x10));
    }
    if (*(long *)((long)result + 0x18) != 0) {
      if (**(char **)((long)result + 0x18) != '\0') {
        unlink(*(char **)((long)result + 0x18));
      }
      free(*(void **)((long)result + 0x18));
    }
  }
  return;
}

Assistant:

void msocket_server_destroy(msocket_server_t *self){
#ifndef _WIN32
   void *result;
#endif

   if(self != 0){
      msocket_t *acceptSocket;
      MUTEX_LOCK(self->mutex);
      self->cleanupStop = 1;
      acceptSocket = self->acceptSocket;
      if(acceptSocket != 0){
         msocket_close(acceptSocket);
         MUTEX_UNLOCK(self->mutex);
#ifdef _WIN32
         WaitForSingleObject( self->acceptThread, INFINITE );
         CloseHandle( self->acceptThread );
#else
         pthread_join(self->acceptThread,&result);
#endif
      }
      else {
         MUTEX_UNLOCK(self->mutex);
      }
      if (self->pDestructor != 0) {
#ifdef _WIN32
         WaitForSingleObject( self->cleanupThread, INFINITE );
         CloseHandle( self->cleanupThread );
#else
         pthread_join(self->cleanupThread,&result);
#endif
      }
      msocket_ary_destroy(&self->cleanupItems);
      SEMAPHORE_DESTROY(self->sem);
      MUTEX_DESTROY(self->mutex);
      if(self->udpAddr != 0){
         free(self->udpAddr);
      }
#ifndef _WIN32
      if(self->socketPath != 0){
         if (self->socketPath[0] != '\0') { //files that belong to the abstract namespace (starts with null-byte) does not need to be explicitly deleted
            unlink(self->socketPath);
         }
         free(self->socketPath);
      }
#endif
   }
}